

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac *pFlac)

{
  ma_uint8 mVar1;
  ma_int32 *pmVar2;
  uint uVar3;
  uint uVar4;
  ma_dr_flac *pmVar5;
  ushort uVar6;
  ma_bool32 mVar7;
  uint uVar8;
  ulong uVar9;
  ma_uint32 lpcOrder;
  ma_int32 *pmVar10;
  long lVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ma_uint32 bitCount;
  ma_dr_flac_subframe *pSubframe;
  ma_uint16 *coefficients;
  ma_uint8 local_109;
  ma_dr_flac_bs *local_108;
  ma_result local_fc;
  long local_f8;
  ulong local_f0;
  ulong local_e8;
  ma_int32 *local_e0;
  uint local_d4;
  ma_dr_flac *local_d0;
  ma_dr_flac_subframe *local_c8;
  ulong local_c0;
  ma_uint16 desiredCRC16;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (pFlac->currentFLACFrame).subframes[7].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[7].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[7].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[7].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[7].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[6].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[6].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[6].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[6].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[6].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[5].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[5].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[5].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[5].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[5].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[4].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[4].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[4].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[4].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[4].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[3].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[3].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[3].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[3].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[3].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[2].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[2].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[2].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[2].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[2].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[1].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[1].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[1].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[1].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[0].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[0].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[0].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[0].pSamplesS32 = (ma_int32 *)0x0;
  local_fc = MA_ERROR;
  if (((pFlac->currentFLACFrame).header.blockSizeInPCMFrames <= pFlac->maxBlockSizeInPCMFrames) &&
     (local_c0 = (ulong)(byte)(&DAT_00177980)
                              [(char)(pFlac->currentFLACFrame).header.channelAssignment],
     (&DAT_00177980)[(char)(pFlac->currentFLACFrame).header.channelAssignment] == pFlac->channels))
  {
    local_c8 = (pFlac->currentFLACFrame).subframes;
    local_108 = &pFlac->bs;
    local_f8 = 0;
    uVar12 = 0;
    local_d0 = pFlac;
    while (pmVar5 = local_d0, uVar12 != local_c0) {
      pmVar2 = local_d0->pDecodedSamples;
      uVar14 = (ulong)(local_d0->currentFLACFrame).header.blockSizeInPCMFrames;
      pSubframe = local_c8 + uVar12;
      mVar7 = ma_dr_flac__read_subframe_header(local_108,pSubframe);
      if (mVar7 == 0) {
        return local_fc;
      }
      mVar1 = (pmVar5->currentFLACFrame).header.channelAssignment;
      uVar15 = (uint)(pmVar5->currentFLACFrame).header.bitsPerSample;
      if (mVar1 == '\b') {
        if (uVar12 != 1) goto LAB_00162317;
LAB_00162341:
        uVar15 = uVar15 + 1;
      }
      else {
        if (uVar12 == 1 && mVar1 == '\n') goto LAB_00162341;
LAB_00162317:
        uVar15 = uVar15 + (uVar12 == 0 && mVar1 == '\t');
      }
      if (0x20 < uVar15) {
        return local_fc;
      }
      uVar16 = uVar15 - pSubframe->wastedBitsPerSample;
      if (uVar15 < pSubframe->wastedBitsPerSample || uVar16 == 0) {
        return local_fc;
      }
      pmVar10 = pmVar2 + uVar12 * uVar14;
      pSubframe->pSamplesS32 = pmVar10;
      uVar13 = (pmVar5->currentFLACFrame).header.blockSizeInPCMFrames;
      uVar6 = (ushort)pSubframe->lpcOrder;
      if (uVar13 < uVar6) {
        return local_fc;
      }
      uVar9 = (ulong)uVar6;
      mVar1 = pSubframe->subframeType;
      local_f0 = uVar9;
      local_e8 = uVar12;
      if (mVar1 == ' ') {
        lVar17 = uVar14 * local_f8;
        local_e0 = pmVar10;
        for (uVar12 = 0; local_f0 != uVar12; uVar12 = uVar12 + 1) {
          mVar7 = ma_dr_flac__read_int32(local_108,uVar16,(ma_int32 *)&desiredCRC16);
          if (mVar7 == 0) goto LAB_001625af;
          *(uint *)((long)pmVar2 + uVar12 * 4 + lVar17) = _desiredCRC16;
        }
        mVar7 = ma_dr_flac__read_uint8(local_108,4,&local_109);
        mVar1 = local_109;
        if (((mVar7 != 0) && (local_109 != '\x0f')) &&
           (mVar7 = ma_dr_flac__read_int32(local_108,5,(ma_int32 *)&desiredCRC16), mVar7 != 0)) {
          local_d4 = _desiredCRC16;
          if (-1 < (char)_desiredCRC16) {
            local_48 = 0;
            uStack_40 = 0;
            local_58 = 0;
            uStack_50 = 0;
            local_68 = 0;
            uStack_60 = 0;
            local_78 = 0;
            uStack_70 = 0;
            local_88 = 0;
            uStack_80 = 0;
            local_98 = 0;
            uStack_90 = 0;
            local_a8 = 0;
            uStack_a0 = 0;
            _desiredCRC16 = 0;
            uStack_b0 = 0;
            bitCount = (ma_uint32)(byte)(mVar1 + 1);
            lVar17 = local_f0 * 4;
            lVar11 = 0;
            do {
              if (lVar17 + 4 == lVar11 + 4) {
                uVar15 = local_d4 & 0x7f;
                lpcOrder = (ma_uint32)local_f0;
                coefficients = &desiredCRC16;
                goto LAB_001625a5;
              }
              mVar7 = ma_dr_flac__read_int32
                                (local_108,bitCount,(ma_int32 *)((long)&desiredCRC16 + lVar11));
              lVar11 = lVar11 + 4;
            } while (mVar7 != 0);
          }
        }
      }
      else if (mVar1 == '\x01') {
        lVar17 = uVar14 * local_f8;
        uVar12 = 0;
        while ((uVar13 != uVar12 &&
               (mVar7 = ma_dr_flac__read_int32(local_108,uVar16,(ma_int32 *)&desiredCRC16),
               mVar7 != 0))) {
          *(uint *)((long)pmVar2 + uVar12 * 4 + lVar17) = _desiredCRC16;
          uVar12 = uVar12 + 1;
        }
      }
      else if (mVar1 == '\b') {
        lVar17 = uVar14 * local_f8;
        local_e0 = pmVar10;
        for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          mVar7 = ma_dr_flac__read_int32(local_108,uVar16,(ma_int32 *)&desiredCRC16);
          if (mVar7 == 0) goto LAB_001625af;
          *(uint *)((long)pmVar2 + uVar12 * 4 + lVar17) = _desiredCRC16;
        }
        lpcOrder = (ma_uint32)local_f0;
        uVar15 = 0;
        bitCount = 4;
        coefficients = (ma_uint16 *)
                       (ma_dr_flac__decode_samples__fixed(ma_dr_flac_bs*,unsigned_int,unsigned_int,unsigned_char,int*)
                        ::lpcCoefficientsTable + (ulong)uVar6 * 0x10);
LAB_001625a5:
        ma_dr_flac__decode_samples_with_residual
                  (local_108,uVar16,(uint)uVar13,lpcOrder,uVar15,bitCount,(ma_int32 *)coefficients,
                   local_e0);
      }
      else {
        if (mVar1 != '\0') {
          return local_fc;
        }
        mVar7 = ma_dr_flac__read_int32(local_108,uVar16,(ma_int32 *)&desiredCRC16);
        if (mVar7 != 0) {
          for (uVar12 = 0; (uint)uVar13 != uVar12; uVar12 = uVar12 + 1) {
            *(uint *)((long)pmVar2 + uVar12 * 4 + uVar14 * local_f8) = _desiredCRC16;
          }
        }
      }
LAB_001625af:
      local_f8 = local_f8 + 4;
      uVar12 = local_e8 + 1;
    }
    uVar15 = (local_d0->bs).consumedBits;
    local_fc = MA_AT_END;
    if ((-uVar15 & 7) != 0) {
      mVar7 = ma_dr_flac__read_uint8(local_108,-uVar15 & 7,(ma_uint8 *)&desiredCRC16);
      if (mVar7 == 0) {
        return local_fc;
      }
      uVar15 = (pmVar5->bs).consumedBits;
    }
    uVar13 = (pmVar5->bs).crc16;
    uVar14 = (ulong)uVar13;
    uVar16 = (uint)uVar13;
    uVar12 = (pmVar5->bs).crc16Cache;
    if (uVar15 == 0x40) {
      uVar8 = (uint)uVar12;
      uVar6 = (ushort)(uVar12 >> 0x30);
      uVar3 = (uint)(uVar12 >> 0x10);
      uVar15 = (uint)(uVar12 >> 0x18);
      uVar4 = (uint)(uVar12 >> 0x20);
      switch((pmVar5->bs).crc16CacheIgnoredBytes) {
      case 0:
        uVar13 = ma_dr_flac__crc16_table
                 [((uint)ma_dr_flac__crc16_table
                         [((uint)ma_dr_flac__crc16_table
                                 [(uVar4 >> 8 ^
                                  ((uint)ma_dr_flac__crc16_table
                                         [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)uVar6 ^
                                         ((uint)uVar13 << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar12 >> 0x38)])
                                         >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                          (uint)ma_dr_flac__crc16_table
                                [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                 [((uint)uVar6 ^
                                                  ((uint)uVar13 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar13 >> 8) ^
                                                         (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                          (uint)ma_dr_flac__crc16_table
                                                [(uVar4 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar13 >> 8) ^
                                                         (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar6 ^
                                                        ((uint)uVar13 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar13 >> 8) ^
                                                               (uint)(byte)(uVar12 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                          0xff) & 0xff]) >> 8 & 0xff ^ uVar15 & 0xff] << 8 ^ uVar8 ^
                  (uint)ma_dr_flac__crc16_table
                        [(((uint)ma_dr_flac__crc16_table
                                 [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                  [((uint)uVar6 ^
                                                   ((uint)uVar13 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar13 >> 8) ^
                                                          (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff
                                                   ) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [(uVar4 >> 8 ^
                                                  ((uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar13 >> 8) ^
                                                          (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar6 ^
                                                         ((uint)uVar13 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar13 >> 8) ^
                                                                (uint)(byte)(uVar12 >> 0x38)]) >> 8
                                                         & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8
                                           & 0xff) & 0xff] << 8 ^
                          (uint)ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [(uVar4 >> 8 ^
                                         ((uint)ma_dr_flac__crc16_table
                                                [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar12 >> 0x38)]
                                          << 8 ^ (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar6 ^
                                                        ((uint)uVar13 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar13 >> 8) ^
                                                               (uint)(byte)(uVar12 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                 (uint)ma_dr_flac__crc16_table
                                       [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar6 ^
                                                         ((uint)uVar13 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar13 >> 8) ^
                                                                (uint)(byte)(uVar12 >> 0x38)]) >> 8
                                                         & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar4 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar13 >> 8) ^
                                                                (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar6 ^
                                                               ((uint)uVar13 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar13 >> 8) ^
                                                                      (uint)(byte)(uVar12 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                 uVar15 & 0xff]) >> 8 & 0xff ^ uVar3 & 0xffff) & 0xff]) >> 8 & 0xff]
                 << 8 ^ ma_dr_flac__crc16_table
                        [(((uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar6 ^
                                                            ((uint)uVar13 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar13 >> 8) ^
                                                                   (uint)(byte)(uVar12 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar4 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar13 >> 8) ^
                                                                   (uint)(byte)(uVar12 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)uVar6 ^
                                                                       ((uint)uVar13 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(uVar13 >> 8) ^
                                                                              (uint)(byte)(uVar12 >>
                                                                                          0x38)]) >>
                                                                       8 & 0xff) & 0xff]) >> 8 &
                                                           0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                   ^ (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar4 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar13 >> 8) ^
                                                            (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar6 ^
                                                           ((uint)uVar13 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar13 >> 8) ^
                                                                  (uint)(byte)(uVar12 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar6 ^
                                                                            ((uint)uVar13 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar13 >> 8) ^
                                                                 (uint)(byte)(uVar12 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar6 ^
                                                                  ((uint)uVar13 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar13 >> 8) ^
                                                                         (uint)(byte)(uVar12 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar15 & 0xff]
                                   ) >> 8 & 0xff ^ uVar3 & 0xffff) & 0xff] << 8 ^
                          (uint)ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [(uVar4 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar13 >> 8) ^
                                                         (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar6 ^
                                                        ((uint)uVar13 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar13 >> 8) ^
                                                               (uint)(byte)(uVar12 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar6 ^
                                                                 ((uint)uVar13 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar13 >> 8) ^
                                                                        (uint)(byte)(uVar12 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar4 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar13 >> 8) ^
                                                                          (uint)(byte)(uVar12 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar6 ^
                                                                         ((uint)uVar13 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                         >> 8 & 0xff ^ uVar15 & 0xff] << 8 ^ uVar8 ^
                                 (uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar6 ^
                                                                  ((uint)uVar13 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar13 >> 8) ^
                                                                         (uint)(byte)(uVar12 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff] << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uVar4 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar13 >> 8) ^
                                                                         (uint)(byte)(uVar12 >> 0x38
                                                                                     )] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar6 ^
                                                                        ((uint)uVar13 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar13 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                          << 8 ^ (uint)ma_dr_flac__crc16_table
                                                       [((uint)ma_dr_flac__crc16_table
                                                               [(uVar4 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar13 >> 8) ^
                                                                        (uint)(byte)(uVar12 >> 0x38)
                                                                       ] << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [((uint)uVar6 ^
                                                                       ((uint)uVar13 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(uVar13 >> 8) ^
                                                                              (uint)(byte)(uVar12 >>
                                                                                          0x38)]) >>
                                                                       8 & 0xff) & 0xff]) >> 8 &
                                                                0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar4 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar6 ^
                                                   ((uint)uVar13 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar13 >> 8) ^
                                                          (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff
                                                   ) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar13 >> 8) ^
                                                                 (uint)(byte)(uVar12 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar6 ^
                                                                  ((uint)uVar13 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar13 >> 8) ^
                                                                         (uint)(byte)(uVar12 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar15 & 0xff]
                                         ) >> 8 & 0xff ^ uVar3 & 0xffff) & 0xff]) >> 8 & 0xff]) >> 8
                          & 0xff ^ uVar8) & 0xff];
        (pmVar5->bs).crc16 = uVar13;
        break;
      case 1:
        uVar14 = (ulong)(ushort)(uVar13 << 8 ^
                                ma_dr_flac__crc16_table[(ushort)(uVar6 ^ uVar13 >> 8) & 0xff]);
      case 2:
        uVar14 = (ulong)(ushort)((ushort)((int)uVar14 << 8) ^
                                ma_dr_flac__crc16_table[(uVar4 >> 8 ^ (uint)(uVar14 >> 8)) & 0xff]);
      case 3:
        uVar14 = (ulong)(ushort)((ushort)((int)uVar14 << 8) ^
                                ma_dr_flac__crc16_table[(uVar4 ^ (uint)(uVar14 >> 8)) & 0xff]);
      case 4:
        uVar14 = (ulong)(ushort)((ushort)((int)uVar14 << 8) ^
                                ma_dr_flac__crc16_table[(uint)(uVar14 >> 8) ^ uVar15 & 0xff]);
      case 5:
        uVar16 = (uint)(ushort)((ushort)((int)uVar14 << 8) ^
                               ma_dr_flac__crc16_table
                               [((uint)(uVar14 >> 8) ^ uVar3 & 0xffff) & 0xff]);
      case 6:
        uVar14 = (ulong)(ushort)((ushort)(uVar16 << 8) ^
                                ma_dr_flac__crc16_table[(uVar8 ^ uVar16) >> 8 & 0xff]);
      case 7:
        uVar13 = (ushort)((int)uVar14 << 8) ^
                 ma_dr_flac__crc16_table[(uVar8 ^ (uint)(uVar14 >> 8)) & 0xff];
      default:
        (pmVar5->bs).crc16 = uVar13;
        (pmVar5->bs).crc16CacheIgnoredBytes = 0;
      }
    }
    else {
      uVar12 = uVar12 >> (-(char)uVar15 & 0x3fU);
      uVar3 = (uint)(uVar12 >> 0x20);
      switch(~(pmVar5->bs).crc16CacheIgnoredBytes + (uVar15 >> 3)) {
      case 7:
        uVar16 = (uint)(ushort)(uVar13 << 8 ^
                               ma_dr_flac__crc16_table
                               [(uint)(uVar13 >> 8) ^ (uint)(byte)(uVar12 >> 0x38)]);
      case 6:
        uVar16 = (uint)(ushort)((ushort)(uVar16 << 8) ^
                               ma_dr_flac__crc16_table
                               [((uint)(ushort)(uVar12 >> 0x30) ^ uVar16 >> 8) & 0xff]);
      case 5:
        uVar16 = (uint)(ushort)((ushort)(uVar16 << 8) ^
                               ma_dr_flac__crc16_table[(uVar3 ^ uVar16) >> 8 & 0xff]);
      case 4:
        uVar16 = (uint)(ushort)((ushort)(uVar16 << 8) ^
                               ma_dr_flac__crc16_table[(uVar3 ^ uVar16 >> 8) & 0xff]);
      case 3:
        uVar16 = (uint)(ushort)((ushort)(uVar16 << 8) ^
                               ma_dr_flac__crc16_table[uVar16 >> 8 ^ (uint)(uVar12 >> 0x18) & 0xff])
        ;
      case 2:
        uVar16 = (uint)(ushort)((ushort)(uVar16 << 8) ^
                               ma_dr_flac__crc16_table
                               [(uVar16 >> 8 ^ (uint)(uVar12 >> 0x10) & 0xffff) & 0xff]);
      case 1:
        uVar14 = (ulong)(ushort)((ushort)(uVar16 << 8) ^
                                ma_dr_flac__crc16_table[((uint)uVar12 ^ uVar16) >> 8 & 0xff]);
      case 0:
        uVar13 = (ushort)((int)uVar14 << 8) ^
                 ma_dr_flac__crc16_table[((uint)uVar12 ^ (uint)(uVar14 >> 8)) & 0xff];
      default:
        (pmVar5->bs).crc16 = uVar13;
        (pmVar5->bs).crc16CacheIgnoredBytes = uVar15 >> 3;
      }
    }
    mVar7 = ma_dr_flac__read_uint16(local_108,0x10,&desiredCRC16);
    if (mVar7 != 0) {
      if (uVar13 == desiredCRC16) {
        (pmVar5->currentFLACFrame).pcmFramesRemaining =
             (uint)(pmVar5->currentFLACFrame).header.blockSizeInPCMFrames;
        local_fc = MA_SUCCESS;
      }
      else {
        local_fc = MA_CRC_MISMATCH;
      }
    }
  }
  return local_fc;
}

Assistant:

static ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint8 paddingSizeInBits;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    MA_DR_FLAC_ZERO_MEMORY(pFlac->currentFLACFrame.subframes, sizeof(pFlac->currentFLACFrame.subframes));
    if (pFlac->currentFLACFrame.header.blockSizeInPCMFrames > pFlac->maxBlockSizeInPCMFrames) {
        return MA_ERROR;
    }
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    if (channelCount != (int)pFlac->channels) {
        return MA_ERROR;
    }
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__decode_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i, pFlac->pDecodedSamples + (pFlac->currentFLACFrame.header.blockSizeInPCMFrames * i))) {
            return MA_ERROR;
        }
    }
    paddingSizeInBits = (ma_uint8)(MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7);
    if (paddingSizeInBits > 0) {
        ma_uint8 padding = 0;
        if (!ma_dr_flac__read_uint8(&pFlac->bs, paddingSizeInBits, &padding)) {
            return MA_AT_END;
        }
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    pFlac->currentFLACFrame.pcmFramesRemaining = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
    return MA_SUCCESS;
}